

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *ppVar2;
  pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *ppVar3;
  FieldDescriptor *pFVar4;
  long lVar5;
  pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *ppVar6;
  FieldDescriptor *pFVar7;
  ulong uVar8;
  FieldDescriptor *in_RSI;
  iterator iVar9;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
LAB_00303029:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == kEmptyGroup + 0x10) goto LAB_00303029;
    if (kSentinel < *pcVar1) {
      return (this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
  ::iterator::operator*((iterator *)this);
  ppVar2 = *(pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> **)
            this;
  if ((ppVar2 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                  *)(kEmptyGroup + 0x10) ||
       ppVar2 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                  *)0x0) || (-1 < *(char *)&ppVar2->first)) {
    ppVar3 = (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
             ((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
             in_RSI)->first;
    if ((ppVar3 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)(kEmptyGroup + 0x10) ||
         ppVar3 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)0x0) || (-1 < *(char *)&ppVar3->first)) {
      if (ppVar2 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                     *)(kEmptyGroup + 0x10) &&
          ppVar3 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                     *)(kEmptyGroup + 0x10)) {
LAB_00303103:
        return (reference)CONCAT71((int7)((ulong)ppVar2 >> 8),ppVar2 == ppVar3);
      }
      if ((ppVar2 ==
          (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
          (kEmptyGroup + 0x10)) !=
          (ppVar3 ==
          (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
          (kEmptyGroup + 0x10))) goto LAB_0030311f;
      if (ppVar2 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                     *)0x0 ||
          ppVar3 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                     *)0x0) goto LAB_00303103;
      if ((ppVar3 ==
          (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
          kSooControl) ==
          (ppVar2 ==
          (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
          kSooControl)) {
        this = (iterator *)(((FieldDescriptor *)this)->all_names_).payload_;
        pFVar4 = ((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                   *)in_RSI)->second;
        if (ppVar2 == (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                       *)kSooControl) {
          if ((FieldDescriptor *)this == pFVar4) goto LAB_00303103;
        }
        else {
          pFVar7 = pFVar4;
          ppVar6 = ppVar3;
          in_RSI = (FieldDescriptor *)this;
          if (ppVar3 < ppVar2) {
            pFVar7 = (FieldDescriptor *)this;
            ppVar6 = ppVar2;
            in_RSI = pFVar4;
          }
          if ((ppVar6 < in_RSI) && (in_RSI <= pFVar7)) goto LAB_00303103;
        }
      }
      container_internal::operator==();
      goto LAB_00303115;
    }
  }
  else {
LAB_00303115:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_0030311f:
  container_internal::operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
  ::
  AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              *)this,(pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                      *)in_RSI);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  lVar5._0_1_ = ((FieldDescriptor *)this)->super_SymbolBase;
  lVar5._1_1_ = ((FieldDescriptor *)this)->field_0x1;
  lVar5._2_1_ = ((FieldDescriptor *)this)->type_;
  lVar5._3_1_ = ((FieldDescriptor *)this)->field_0x3;
  lVar5._4_4_ = ((FieldDescriptor *)this)->number_;
  if (lVar5 == 1) {
    iVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::
            find_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                        *)this,(key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                                *)in_RSI);
    return (reference)iVar9.ctrl_;
  }
  if (lVar5 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  uVar8 = ((ulong)((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)in_RSI)->first ^ 0x572bc8) * -0x234dd359734ecb13;
  uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^
          (ulong)((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                   *)in_RSI)->first) * -0x234dd359734ecb13;
  uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^
          (ulong)((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                   *)in_RSI)->second) * -0x234dd359734ecb13;
  uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^
          (ulong)((pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                   *)in_RSI)->second) * -0x234dd359734ecb13;
  iVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
          ::
          find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                      *)this,(key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                              *)in_RSI,
                     uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
  return (reference)iVar9.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }